

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint32_t u)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t p1;
  uint64_t p0;
  uint64_t ud;
  uint64_t uc;
  uint64_t d;
  uint64_t c;
  size_t i;
  uint64_t k;
  uint32_t u_local;
  BigInteger *this_local;
  
  if (u == 0) {
    this_local = operator=(this,0);
  }
  else {
    this_local = this;
    if (u != 1) {
      bVar1 = operator==(this,1);
      if (bVar1) {
        this_local = operator=(this,(ulong)u);
      }
      else {
        i = 0;
        for (c = 0; c < this->count_; c = c + 1) {
          uVar2 = (ulong)u * (this->digits_[c] & 0xffffffff) + i;
          uVar3 = (ulong)u * (this->digits_[c] >> 0x20) + (uVar2 >> 0x20);
          this->digits_[c] = uVar2 & 0xffffffff | uVar3 << 0x20;
          i = uVar3 >> 0x20;
        }
        if (i != 0) {
          PushBack(this,i);
        }
      }
    }
  }
  return this_local;
}

Assistant:

BigInteger& operator*=(uint32_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            const uint64_t c = digits_[i] >> 32;
            const uint64_t d = digits_[i] & 0xFFFFFFFF;
            const uint64_t uc = u * c;
            const uint64_t ud = u * d;
            const uint64_t p0 = ud + k;
            const uint64_t p1 = uc + (p0 >> 32);
            digits_[i] = (p0 & 0xFFFFFFFF) | (p1 << 32);
            k = p1 >> 32;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }